

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O1

char * __thiscall
Messages::AddressBook::_InternalParse(AddressBook *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  ulong uVar5;
  bool bVar6;
  Person *msg;
  char cVar7;
  uint uVar8;
  UnknownFieldSet *pUVar9;
  undefined1 auVar10 [12];
  byte *local_38;
  
  local_38 = (byte *)ptr;
  do {
    bVar6 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar6) {
      return (char *)local_38;
    }
    bVar1 = *local_38;
    auVar10[8] = bVar1;
    auVar10._0_8_ = local_38 + 1;
    auVar10._9_3_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = local_38[1];
      uVar8 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        auVar10 = google::protobuf::internal::ReadTagFallback((char *)local_38,uVar8);
      }
      else {
        auVar10._8_4_ = uVar8;
        auVar10._0_8_ = local_38 + 2;
      }
    }
    uVar8 = auVar10._8_4_;
    local_38 = auVar10._0_8_;
    if (local_38 == (byte *)0x0) {
LAB_0010981b:
      cVar7 = '\x04';
    }
    else if (uVar8 == 10) {
      local_38 = local_38 + -1;
      do {
        local_38 = local_38 + 1;
        pRVar4 = (this->people_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar4 == (Rep *)0x0) {
LAB_00109763:
          google::protobuf::internal::RepeatedPtrFieldBase::Reserve((int)this + 0x10);
LAB_00109771:
          pRVar4 = (this->people_).super_RepeatedPtrFieldBase.rep_;
          pRVar4->allocated_size = pRVar4->allocated_size + 1;
          msg = google::protobuf::Arena::CreateMaybeMessage<Messages::Person>
                          ((this->people_).super_RepeatedPtrFieldBase.arena_);
          pRVar4 = (this->people_).super_RepeatedPtrFieldBase.rep_;
          iVar3 = (this->people_).super_RepeatedPtrFieldBase.current_size_;
          (this->people_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
          pRVar4->elements[iVar3] = msg;
        }
        else {
          iVar3 = (this->people_).super_RepeatedPtrFieldBase.current_size_;
          if (pRVar4->allocated_size <= iVar3) {
            if (pRVar4->allocated_size == (this->people_).super_RepeatedPtrFieldBase.total_size_)
            goto LAB_00109763;
            goto LAB_00109771;
          }
          (this->people_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
          msg = (Person *)pRVar4->elements[iVar3];
        }
        local_38 = (byte *)google::protobuf::internal::ParseContext::ParseMessage<Messages::Person>
                                     (ctx,msg,(char *)local_38);
        if (local_38 == (byte *)0x0) goto LAB_0010981b;
        cVar7 = '\x02';
      } while ((local_38 < *(byte **)ctx) && (*local_38 == 10));
    }
    else if (uVar8 == 0 || (uVar8 & 7) == 4) {
      *(uint *)&ctx->field_0x50 = uVar8 - 1;
      cVar7 = '\t';
    }
    else {
      uVar5 = *(ulong *)&this->field_0x8;
      if ((uVar5 & 1) == 0) {
        pUVar9 = google::protobuf::internal::InternalMetadata::
                 mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                           ((InternalMetadata *)&this->field_0x8);
      }
      else {
        pUVar9 = (UnknownFieldSet *)((uVar5 & 0xfffffffffffffffe) + 8);
      }
      local_38 = (byte *)google::protobuf::internal::UnknownFieldParse
                                   ((ulong)uVar8,pUVar9,(char *)local_38,ctx);
      cVar7 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
    }
    if (cVar7 != '\x02') {
      if (cVar7 == '\x04') {
        local_38 = (byte *)0x0;
      }
      return (char *)local_38;
    }
  } while( true );
}

Assistant:

const char* AddressBook::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .Messages.Person people = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_people(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}